

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossibleUdpEntry(TokenKind kind)

{
  TokenKind kind_local;
  bool local_1;
  
  if ((((kind == Identifier) || ((ushort)(kind - IntegerLiteral) < 2)) || (kind == OpenParenthesis))
     || ((((ushort)(kind - Semicolon) < 2 || (kind == Star)) ||
         ((kind == Minus || (kind == Question)))))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isPossibleUdpEntry(TokenKind kind) {
    switch (kind) {
        case TokenKind::IntegerLiteral:
        case TokenKind::IntegerBase:
        case TokenKind::Question:
        case TokenKind::Colon:
        case TokenKind::Semicolon:
        case TokenKind::Star:
        case TokenKind::Minus:
        case TokenKind::OpenParenthesis:
        case TokenKind::Identifier:
            return true;
        default:
            return false;
    }
}